

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O1

void __thiscall
btMultiBody::solveImatrix(btMultiBody *this,btVector3 *rhs_top,btVector3 *rhs_bot,float *result)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  
  if ((this->m_links).m_size == 0) {
    *result = rhs_bot->m_floats[0] / (this->m_baseInertia).m_floats[0];
    result[1] = rhs_bot->m_floats[1] / (this->m_baseInertia).m_floats[1];
    result[2] = rhs_bot->m_floats[2] / (this->m_baseInertia).m_floats[2];
    result[3] = rhs_top->m_floats[0] / this->m_baseMass;
    result[4] = rhs_top->m_floats[1] / this->m_baseMass;
    fVar5 = rhs_top->m_floats[2] / this->m_baseMass;
  }
  else {
    fVar5 = (this->m_cachedInertiaTopRight).m_el[1].m_floats[1];
    fVar1 = (this->m_cachedInertiaTopRight).m_el[2].m_floats[2];
    fVar2 = (this->m_cachedInertiaTopRight).m_el[1].m_floats[2];
    fVar21 = (this->m_cachedInertiaTopRight).m_el[2].m_floats[1];
    uVar3 = *(undefined8 *)((this->m_cachedInertiaTopRight).m_el[0].m_floats + 1);
    fVar19 = (float)uVar3;
    fVar22 = (float)((ulong)uVar3 >> 0x20);
    fVar25 = fVar5 * fVar1 - fVar21 * fVar2;
    fVar24 = (this->m_cachedInertiaTopRight).m_el[2].m_floats[0];
    fVar36 = (this->m_cachedInertiaTopRight).m_el[1].m_floats[0];
    fVar29 = fVar2 * fVar24 - fVar1 * fVar36;
    fVar40 = (this->m_cachedInertiaTopRight).m_el[0].m_floats[0];
    fVar34 = fVar36 * fVar21 - fVar24 * fVar5;
    fVar18 = 1.0 / (fVar22 * fVar34 + fVar25 * fVar40 + fVar29 * fVar19);
    fVar42 = (this->m_cachedInertiaLowerRight).m_el[1].m_floats[0];
    fVar14 = (this->m_cachedInertiaLowerRight).m_el[1].m_floats[1];
    fVar17 = (this->m_cachedInertiaLowerRight).m_el[1].m_floats[2];
    fVar12 = -fVar25 * fVar18;
    fVar37 = -(fVar22 * fVar21 - fVar1 * fVar19) * fVar18;
    fVar49 = -fVar29 * fVar18;
    fVar43 = -(-fVar22 * fVar24 + fVar40 * fVar1) * fVar18;
    fVar15 = -(fVar40 * fVar5 - fVar36 * fVar19) * fVar18;
    fVar30 = -fVar34 * fVar18;
    fVar31 = -(fVar19 * fVar2 - fVar5 * fVar22) * fVar18;
    fVar32 = -(fVar24 * fVar19 - fVar40 * fVar21) * fVar18;
    fVar18 = -(fVar36 * fVar22 - fVar40 * fVar2) * fVar18;
    fVar13 = fVar30 * fVar17 + fVar12 * fVar42 + fVar49 * fVar14;
    fVar16 = fVar32 * fVar17 + fVar37 * fVar42 + fVar43 * fVar14;
    fVar26 = fVar15 * fVar17 + fVar31 * fVar42 + fVar18 * fVar14;
    fVar5 = (this->m_cachedInertiaTopLeft).m_el[1].m_floats[2];
    fVar1 = (this->m_cachedInertiaTopLeft).m_el[0].m_floats[2];
    fVar2 = (this->m_cachedInertiaTopLeft).m_el[2].m_floats[2];
    uVar3 = *(undefined8 *)(this->m_cachedInertiaTopLeft).m_el[1].m_floats;
    fVar25 = (float)uVar3;
    fVar6 = (float)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(this->m_cachedInertiaTopLeft).m_el[0].m_floats;
    fVar29 = (float)uVar3;
    fVar7 = (float)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(this->m_cachedInertiaTopLeft).m_el[2].m_floats;
    fVar34 = (float)uVar3;
    fVar8 = (float)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(this->m_cachedInertiaLowerLeft).m_el[1].m_floats;
    fVar27 = fVar26 * fVar34 + fVar13 * fVar29 + fVar16 * fVar25 + (float)uVar3;
    fVar28 = fVar26 * fVar8 + fVar13 * fVar7 + fVar16 * fVar6 + (float)((ulong)uVar3 >> 0x20);
    fVar21 = (this->m_cachedInertiaLowerRight).m_el[0].m_floats[1];
    fVar24 = (this->m_cachedInertiaLowerRight).m_el[2].m_floats[1];
    fVar36 = (this->m_cachedInertiaLowerRight).m_el[0].m_floats[0];
    fVar40 = (this->m_cachedInertiaLowerRight).m_el[2].m_floats[0];
    fVar19 = (this->m_cachedInertiaLowerRight).m_el[0].m_floats[2];
    fVar22 = (this->m_cachedInertiaLowerRight).m_el[2].m_floats[2];
    fVar4 = fVar30 * fVar22 + fVar12 * fVar40 + fVar49 * fVar24;
    fVar9 = fVar30 * fVar19 + fVar12 * fVar36 + fVar49 * fVar21;
    fVar20 = fVar32 * fVar22 + fVar37 * fVar40 + fVar43 * fVar24;
    fVar23 = fVar32 * fVar19 + fVar37 * fVar36 + fVar43 * fVar21;
    fVar44 = fVar22 * fVar15 + fVar40 * fVar31 + fVar24 * fVar18;
    fVar47 = fVar19 * fVar15 + fVar36 * fVar31 + fVar21 * fVar18;
    fVar10 = fVar47 * fVar2 + fVar9 * fVar1 + fVar23 * fVar5 +
             (this->m_cachedInertiaLowerLeft).m_el[0].m_floats[2];
    fVar11 = fVar47 * fVar34 + fVar9 * fVar29 + fVar23 * fVar25 +
             (this->m_cachedInertiaLowerLeft).m_el[0].m_floats[0];
    fVar38 = (this->m_cachedInertiaLowerLeft).m_el[2].m_floats[2] +
             fVar2 * fVar44 + fVar1 * fVar4 + fVar5 * fVar20;
    fVar47 = (this->m_cachedInertiaLowerLeft).m_el[0].m_floats[1] +
             fVar8 * fVar47 + fVar7 * fVar9 + fVar6 * fVar23;
    uVar3 = *(undefined8 *)(this->m_cachedInertiaLowerLeft).m_el[2].m_floats;
    fVar45 = fVar44 * fVar34 + fVar4 * fVar29 + fVar20 * fVar25 + (float)uVar3;
    fVar20 = fVar44 * fVar8 + fVar4 * fVar7 + fVar20 * fVar6 + (float)((ulong)uVar3 >> 0x20);
    fVar9 = fVar2 * fVar26 + fVar1 * fVar13 + fVar16 * fVar5 +
            (this->m_cachedInertiaLowerLeft).m_el[1].m_floats[2];
    fVar23 = fVar28 * fVar38 - fVar9 * fVar20;
    fVar39 = fVar9 * fVar45 - fVar38 * fVar27;
    fVar41 = fVar27 * fVar20 - fVar45 * fVar28;
    fVar4 = 1.0 / (fVar41 * fVar10 + fVar11 * fVar23 + fVar47 * fVar39);
    fVar23 = fVar23 * fVar4;
    fVar50 = (fVar20 * fVar10 + -fVar47 * fVar38) * fVar4;
    fVar13 = (fVar47 * fVar9 - fVar28 * fVar10) * fVar4;
    fVar39 = fVar39 * fVar4;
    fVar41 = fVar41 * fVar4;
    fVar46 = (fVar11 * fVar38 + -fVar10 * fVar45) * fVar4;
    fVar48 = (fVar45 * fVar47 + -fVar11 * fVar20) * fVar4;
    fVar44 = (fVar10 * fVar27 - fVar11 * fVar9) * fVar4;
    fVar4 = (fVar11 * fVar28 - fVar47 * fVar27) * fVar4;
    fVar9 = fVar40 * fVar13 + fVar36 * fVar23 + fVar42 * fVar50;
    fVar16 = fVar24 * fVar13 + fVar21 * fVar23 + fVar14 * fVar50;
    fVar20 = fVar22 * fVar13 + fVar19 * fVar23 + fVar17 * fVar50;
    fVar10 = fVar30 * fVar20 + fVar12 * fVar9 + fVar49 * fVar16;
    fVar11 = fVar32 * fVar20 + fVar37 * fVar9 + fVar43 * fVar16;
    fVar26 = fVar40 * fVar44 + fVar36 * fVar39 + fVar42 * fVar46;
    fVar36 = fVar40 * fVar4 + fVar36 * fVar41 + fVar42 * fVar48;
    fVar40 = fVar24 * fVar44 + fVar21 * fVar39 + fVar14 * fVar46;
    fVar42 = fVar24 * fVar4 + fVar21 * fVar41 + fVar14 * fVar48;
    fVar21 = fVar22 * fVar44 + fVar19 * fVar39 + fVar17 * fVar46;
    fVar24 = fVar22 * fVar4 + fVar19 * fVar41 + fVar17 * fVar48;
    fVar38 = fVar32 * fVar21 + fVar37 * fVar26 + fVar43 * fVar40;
    fVar47 = fVar32 * fVar24 + fVar37 * fVar36 + fVar43 * fVar42;
    fVar14 = fVar47 * fVar1 + fVar11 * fVar29 + fVar7 * fVar38;
    fVar51 = fVar47 * fVar2 + fVar11 * fVar34 + fVar8 * fVar38;
    fVar35 = fVar24 * fVar15 + fVar36 * fVar31 + fVar18 * fVar42;
    fVar22 = fVar30 * fVar21 + fVar12 * fVar26 + fVar49 * fVar40;
    fVar27 = fVar30 * fVar24 + fVar12 * fVar36 + fVar49 * fVar42;
    fVar45 = fVar47 * fVar5 + fVar11 * fVar25 + fVar6 * fVar38 + -1.0;
    fVar19 = fVar21 * fVar15 + fVar26 * fVar31 + fVar40 * fVar18;
    fVar26 = fVar27 * fVar5 + fVar10 * fVar25 + fVar6 * fVar22;
    fVar33 = fVar27 * fVar2 + fVar10 * fVar34 + fVar8 * fVar22;
    fVar28 = fVar27 * fVar1 + fVar10 * fVar29 + fVar7 * fVar22 + -1.0;
    fVar9 = fVar20 * fVar15 + fVar9 * fVar31 + fVar16 * fVar18;
    fVar17 = fVar1 * fVar35 + fVar29 * fVar9 + fVar7 * fVar19;
    fVar25 = fVar5 * fVar35 + fVar25 * fVar9 + fVar6 * fVar19;
    fVar42 = fVar2 * fVar35 + fVar9 * fVar34 + fVar19 * fVar8 + -1.0;
    fVar1 = rhs_top->m_floats[1];
    fVar2 = rhs_top->m_floats[0];
    fVar21 = rhs_top->m_floats[2];
    fVar24 = rhs_bot->m_floats[1];
    fVar36 = rhs_bot->m_floats[0];
    fVar40 = rhs_bot->m_floats[2];
    fVar5 = fVar35 * fVar40 + fVar9 * fVar36 + fVar19 * fVar24 +
            (fVar42 * fVar15 + fVar17 * fVar30 + fVar25 * fVar32) * fVar21 +
            (fVar33 * fVar15 + fVar28 * fVar30 + fVar26 * fVar32) * fVar2 +
            (fVar51 * fVar15 + fVar14 * fVar30 + fVar45 * fVar32) * fVar1;
    *result = fVar40 * fVar13 + fVar36 * fVar23 + fVar50 * fVar24 +
              fVar21 * fVar9 + fVar2 * fVar10 + fVar11 * fVar1;
    result[1] = fVar40 * fVar44 + fVar36 * fVar39 + fVar46 * fVar24 +
                fVar21 * fVar19 + fVar2 * fVar22 + fVar38 * fVar1;
    result[2] = fVar40 * fVar4 + fVar36 * fVar41 + fVar48 * fVar24 +
                fVar21 * fVar35 + fVar2 * fVar27 + fVar47 * fVar1;
    result[3] = fVar40 * fVar27 + fVar36 * fVar10 + fVar22 * fVar24 +
                fVar21 * (fVar31 * fVar42 + fVar12 * fVar17 + fVar37 * fVar25) +
                fVar2 * (fVar33 * fVar31 + fVar28 * fVar12 + fVar37 * fVar26) +
                (fVar51 * fVar31 + fVar14 * fVar12 + fVar37 * fVar45) * fVar1;
    result[4] = fVar38 * fVar24 + fVar11 * fVar36 + fVar47 * fVar40 +
                (fVar51 * fVar18 + fVar14 * fVar49 + fVar45 * fVar43) * fVar1 +
                (fVar33 * fVar18 + fVar28 * fVar49 + fVar26 * fVar43) * fVar2 +
                (fVar18 * fVar42 + fVar49 * fVar17 + fVar43 * fVar25) * fVar21;
  }
  result[5] = fVar5;
  return;
}

Assistant:

void btMultiBody::solveImatrix(const btVector3& rhs_top, const btVector3& rhs_bot, float result[6]) const
{
	int num_links = getNumLinks();
	///solve I * x = rhs, so the result = invI * rhs
    if (num_links == 0) 
	{
		// in the case of 0 m_links (i.e. a plain rigid body, not a multibody) rhs * invI is easier
        result[0] = rhs_bot[0] / m_baseInertia[0];
        result[1] = rhs_bot[1] / m_baseInertia[1];
        result[2] = rhs_bot[2] / m_baseInertia[2];
        result[3] = rhs_top[0] / m_baseMass;
        result[4] = rhs_top[1] / m_baseMass;
        result[5] = rhs_top[2] / m_baseMass;
    } else 
	{
		/// Special routine for calculating the inverse of a spatial inertia matrix
		///the 6x6 matrix is stored as 4 blocks of 3x3 matrices
		btMatrix3x3 Binv = m_cachedInertiaTopRight.inverse()*-1.f;
		btMatrix3x3 tmp = m_cachedInertiaLowerRight * Binv;
		btMatrix3x3 invIupper_right = (tmp * m_cachedInertiaTopLeft + m_cachedInertiaLowerLeft).inverse();
		tmp = invIupper_right * m_cachedInertiaLowerRight;
		btMatrix3x3 invI_upper_left = (tmp * Binv);
		btMatrix3x3 invI_lower_right = (invI_upper_left).transpose();
		tmp = m_cachedInertiaTopLeft  * invI_upper_left;
		tmp[0][0]-= 1.0;
		tmp[1][1]-= 1.0;
		tmp[2][2]-= 1.0;
		btMatrix3x3 invI_lower_left = (Binv * tmp);

		//multiply result = invI * rhs
		{
		  btVector3 vtop = invI_upper_left*rhs_top;
		  btVector3 tmp;
		  tmp = invIupper_right * rhs_bot;
		  vtop += tmp;
		  btVector3 vbot = invI_lower_left*rhs_top;
		  tmp = invI_lower_right * rhs_bot;
		  vbot += tmp;
		  result[0] = vtop[0];
		  result[1] = vtop[1];
		  result[2] = vtop[2];
		  result[3] = vbot[0];
		  result[4] = vbot[1];
		  result[5] = vbot[2];
		}
		
    }
}